

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::CopyPublicDependenciesAliases
          (Generator *this,string *copy_from,FileDescriptor *file)

{
  FileDescriptor *pFVar1;
  int index;
  string module_alias;
  string module_name;
  
  for (index = 0; index < *(int *)(file + 0x38); index = index + 1) {
    pFVar1 = FileDescriptor::public_dependency(file,index);
    anon_unknown_0::ModuleName(&module_name,*(string **)pFVar1);
    pFVar1 = FileDescriptor::public_dependency(file,index);
    anon_unknown_0::ModuleAlias(&module_alias,*(string **)pFVar1);
    io::Printer::Print(this->printer_,
                       "try:\n  $alias$ = $copy_from$.$alias$\nexcept AttributeError:\n  $alias$ = $copy_from$.$module$\n"
                       ,"alias",&module_alias,"module",&module_name,"copy_from",copy_from);
    pFVar1 = FileDescriptor::public_dependency(file,index);
    CopyPublicDependenciesAliases(this,copy_from,pFVar1);
    std::__cxx11::string::~string((string *)&module_alias);
    std::__cxx11::string::~string((string *)&module_name);
  }
  return;
}

Assistant:

void Generator::CopyPublicDependenciesAliases(
    const string& copy_from, const FileDescriptor* file) const {
  for (int i = 0; i < file->public_dependency_count(); ++i) {
    string module_name = ModuleName(file->public_dependency(i)->name());
    string module_alias = ModuleAlias(file->public_dependency(i)->name());
    // There's no module alias in the dependent file if it was generated by
    // an old protoc (less than 3.0.0-alpha-1). Use module name in this
    // situation.
    printer_->Print("try:\n"
                    "  $alias$ = $copy_from$.$alias$\n"
                    "except AttributeError:\n"
                    "  $alias$ = $copy_from$.$module$\n",
                    "alias", module_alias,
                    "module", module_name,
                    "copy_from", copy_from);
    CopyPublicDependenciesAliases(copy_from, file->public_dependency(i));
  }
}